

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderDepth(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = 0;
  }
  else if (reader->curnode == (xmlNodePtr)0x0) {
    reader_local._4_4_ = reader->depth;
  }
  else if ((reader->curnode->type == XML_ATTRIBUTE_NODE) ||
          (reader->curnode->type == XML_NAMESPACE_DECL)) {
    reader_local._4_4_ = reader->depth + 1;
  }
  else {
    reader_local._4_4_ = reader->depth + 2;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderDepth(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);

    if (reader->curnode != NULL) {
	if ((reader->curnode->type == XML_ATTRIBUTE_NODE) ||
	    (reader->curnode->type == XML_NAMESPACE_DECL))
	    return(reader->depth + 1);
	return(reader->depth + 2);
    }
    return(reader->depth);
}